

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

bool __thiscall wabt::WastParser::PeekMatchExpr(WastParser *this)

{
  bool bVar1;
  TokenType TVar2;
  TokenType token_type;
  byte bVar3;
  
  bVar3 = 0;
  TVar2 = Peek(this,0);
  token_type = Peek(this,1);
  if (TVar2 == Lpar) {
    bVar1 = anon_unknown_1::IsPlainInstr(token_type);
    bVar3 = 1;
    if (!bVar1) {
      if (token_type - Block < 0x38) {
        bVar3 = (byte)(0x80000001080001 >> ((byte)(token_type - Block) & 0x3f));
      }
      else {
        bVar3 = 0;
      }
    }
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool WastParser::PeekMatchExpr() {
  return IsExpr(PeekPair());
}